

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void add_variable(ch_compilation *comp,ch_lexeme name)

{
  byte bVar1;
  ch_scope *scope;
  ch_emit_scope *blob;
  _Bool _Var2;
  ch_dataptr value;
  size_t size;
  char *value_00;
  ulong uVar3;
  ch_op op;
  uint8_t local_2c [4];
  
  size = name.size;
  value_00 = name.start;
  scope = comp->scope;
  bVar1 = scope->locals_size;
  uVar3 = (ulong)bVar1;
  if (uVar3 == 0xff) {
    error(comp,"Exceeded variable limit in scope.");
    return;
  }
  _Var2 = scope_lookup(scope,name,(uint8_t *)0x0);
  if (_Var2) {
    error(comp,"Variable has already been defined: %.*s",size,value_00);
    return;
  }
  blob = (comp->emit).emit_scope;
  if (blob->parent == (ch_emit_scope *)0x0) {
    op = OP_DEFINE_GLOBAL;
    ch_emit_write(&blob->bytecode,&op,1);
    value = emit_string(comp,value_00,size);
    ch_uint32_to_le_array(value,local_2c);
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,local_2c,4);
  }
  else {
    scope->locals_size = bVar1 + 1;
    scope->locals[uVar3].name.start = value_00;
    scope->locals[uVar3].name.size = size;
    scope->locals[uVar3].is_captured = false;
  }
  return;
}

Assistant:

void add_variable(ch_compilation *comp, ch_lexeme name) {
  if (comp->scope->locals_size == UINT8_MAX) {
    error(comp, "Exceeded variable limit in scope.");
    return;
  }

  if (scope_lookup(comp->scope, name, NULL)) {
    error(comp, "Variable has already been defined: %.*s", name.size,
          name.start);
    return;
  }

  if (CH_EMITTING_GLOBALLY(GET_EMIT(comp))) {
    add_global(comp, name);
  } else {
    add_local(comp, name);
  }
}